

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int nni_chunk_trim(nni_chunk *ch,size_t len)

{
  size_t len_local;
  nni_chunk *ch_local;
  
  if (ch->ch_len < len) {
    ch_local._4_4_ = 3;
  }
  else {
    ch->ch_len = ch->ch_len - len;
    if (ch->ch_len != 0) {
      ch->ch_ptr = ch->ch_ptr + len;
    }
    ch_local._4_4_ = 0;
  }
  return ch_local._4_4_;
}

Assistant:

static int
nni_chunk_trim(nni_chunk *ch, size_t len)
{
	if (ch->ch_len < len) {
		return (NNG_EINVAL);
	}
	ch->ch_len -= len;
	// Don't advance the pointer if we are just removing the whole content
	if (ch->ch_len != 0) {
		ch->ch_ptr += len;
	}
	return (0);
}